

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O0

int __thiscall
pbrt::WorkQueue<pbrt::MaterialEvalWorkItem<pbrt::DielectricMaterial>_>::AllocateEntry
          (WorkQueue<pbrt::MaterialEvalWorkItem<pbrt::DielectricMaterial>_> *this)

{
  int iVar1;
  atomic<int> *paVar2;
  WorkQueue<pbrt::MaterialEvalWorkItem<pbrt::DielectricMaterial>_> *this_local;
  
  paVar2 = &this->size;
  LOCK();
  iVar1 = (paVar2->super___atomic_base<int>)._M_i;
  (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  return iVar1;
}

Assistant:

PBRT_CPU_GPU
    int AllocateEntry() {
#ifdef PBRT_IS_GPU_CODE
#ifdef PBRT_USE_LEGACY_CUDA_ATOMICS
        return atomicAdd(&size, 1);
#else
        return size.fetch_add(1, cuda::std::memory_order_relaxed);
#endif
#else
        return size.fetch_add(1, std::memory_order_relaxed);
#endif
    }